

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateSerializationCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  string_view text;
  
  text._M_str = 
  "com.google.protobuf.GeneratedMessage\n  .serialize$short_key_type$MapTo(\n    output,\n    internalGet$capitalized_name$(),\n    $default_entry$,\n    $number$);\n"
  ;
  text._M_len = 0x9d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateSerializationCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "com.google.protobuf.GeneratedMessage\n"
                 "  .serialize$short_key_type$MapTo(\n"
                 "    output,\n"
                 "    internalGet$capitalized_name$(),\n"
                 "    $default_entry$,\n"
                 "    $number$);\n");
}